

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

void do_sat_addsub_32(TCGContext_conflict1 *tcg_ctx,TCGv_i64 reg,TCGv_i64 val,_Bool u,_Bool d)

{
  TCGv_i64 c2;
  undefined7 in_register_00000009;
  TCGCond cond;
  ulong val_00;
  uintptr_t o;
  uintptr_t o_1;
  
  if ((int)CONCAT71(in_register_00000009,u) == 0) {
    tcg_gen_ext32s_i64_aarch64(tcg_ctx,reg,reg);
  }
  else {
    tcg_gen_ext32u_i64_aarch64(tcg_ctx,reg,reg);
  }
  if (d) {
    tcg_gen_sub_i64(tcg_ctx,reg,reg,val);
    val_00 = (ulong)((uint)u << 0x1f) - 0x80000000;
    cond = TCG_COND_LT;
  }
  else {
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_add_i64,(TCGArg)(reg + (long)&tcg_ctx->pool_cur),
                        (TCGArg)(reg + (long)&tcg_ctx->pool_cur),(TCGArg)(val + (long)tcg_ctx));
    val_00 = (ulong)((uint)u << 0x1f) | 0x7fffffff;
    cond = TCG_COND_GT;
  }
  c2 = tcg_const_i64_aarch64(tcg_ctx,val_00);
  tcg_gen_movcond_i64_aarch64(tcg_ctx,cond,reg,reg,c2,c2,reg);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  return;
}

Assistant:

static void do_sat_addsub_32(TCGContext *tcg_ctx, TCGv_i64 reg, TCGv_i64 val, bool u, bool d)
{
    int64_t ibound;
    TCGv_i64 bound;
    TCGCond cond;

    /* Use normal 64-bit arithmetic to detect 32-bit overflow.  */
    if (u) {
        tcg_gen_ext32u_i64(tcg_ctx, reg, reg);
    } else {
        tcg_gen_ext32s_i64(tcg_ctx, reg, reg);
    }
    if (d) {
        tcg_gen_sub_i64(tcg_ctx, reg, reg, val);
        ibound = (u ? 0 : INT32_MIN);
        cond = TCG_COND_LT;
    } else {
        tcg_gen_add_i64(tcg_ctx, reg, reg, val);
        ibound = (u ? UINT32_MAX : INT32_MAX);
        cond = TCG_COND_GT;
    }
    bound = tcg_const_i64(tcg_ctx, ibound);
    tcg_gen_movcond_i64(tcg_ctx, cond, reg, reg, bound, bound, reg);
    tcg_temp_free_i64(tcg_ctx, bound);
}